

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIListBox::recalculateItemHeight(CGUIListBox *this)

{
  int *piVar1;
  _func_int *p_Var2;
  int iVar3;
  long *plVar4;
  IGUIFont *pIVar5;
  IGUIFont *pIVar6;
  int extraout_var;
  uint uVar7;
  uint uVar8;
  
  plVar4 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  pIVar6 = this->Font;
  pIVar5 = (IGUIFont *)(**(code **)(*plVar4 + 0x30))(plVar4,0);
  if (pIVar6 != pIVar5) {
    pIVar6 = this->Font;
    if (pIVar6 != (IGUIFont *)0x0) {
      p_Var2 = pIVar6->_vptr_IGUIFont[-3];
      piVar1 = (int *)(&pIVar6->field_0x10 + (long)p_Var2);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(code **)(*(long *)((long)&pIVar6->_vptr_IGUIFont + (long)p_Var2) + 8))();
      }
    }
    pIVar6 = (IGUIFont *)(**(code **)(*plVar4 + 0x30))(plVar4,0);
    this->Font = pIVar6;
    if (this->ItemHeightOverride == 0) {
      this->ItemHeight = 0;
    }
    if (pIVar6 != (IGUIFont *)0x0) {
      if (this->ItemHeightOverride == 0) {
        (*pIVar6->_vptr_IGUIFont[1])(pIVar6,L"A");
        this->ItemHeight = extraout_var + 4;
      }
      piVar1 = (int *)(&this->Font->field_0x10 + (long)this->Font->_vptr_IGUIFont[-3]);
      *piVar1 = *piVar1 + 1;
    }
  }
  iVar3 = (int)((ulong)((long)(this->Items).m_data.
                              super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->Items).m_data.
                             super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * this->ItemHeight *
          0x38e38e39;
  this->TotalItemHeight = iVar3;
  uVar7 = (*(int *)&this->field_0x44 - *(int *)&this->field_0x4c) + iVar3;
  uVar8 = 0;
  if (0 < (int)uVar7) {
    uVar8 = uVar7;
  }
  (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x24])
            (this->ScrollBar,(ulong)uVar8);
  uVar8 = 1;
  if (1 < this->ItemHeight) {
    uVar8 = this->ItemHeight;
  }
  (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x29])
            (this->ScrollBar,(ulong)uVar8);
  (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2b])
            (this->ScrollBar,(ulong)(uVar8 * 2));
  (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])
            (this->ScrollBar,
             (ulong)(*(int *)&this->field_0x4c - *(int *)&this->field_0x44 < this->TotalItemHeight))
  ;
  return;
}

Assistant:

void CGUIListBox::recalculateItemHeight()
{
	IGUISkin *skin = Environment->getSkin();

	if (Font != skin->getFont()) {
		if (Font)
			Font->drop();

		Font = skin->getFont();
		if (0 == ItemHeightOverride)
			ItemHeight = 0;

		if (Font) {
			if (0 == ItemHeightOverride)
				ItemHeight = Font->getDimension(L"A").Height + 4;

			Font->grab();
		}
	}

	TotalItemHeight = ItemHeight * Items.size();
	ScrollBar->setMax(core::max_(0, TotalItemHeight - AbsoluteRect.getHeight()));
	s32 minItemHeight = ItemHeight > 0 ? ItemHeight : 1;
	ScrollBar->setSmallStep(minItemHeight);
	ScrollBar->setLargeStep(2 * minItemHeight);

	if (TotalItemHeight <= AbsoluteRect.getHeight())
		ScrollBar->setVisible(false);
	else
		ScrollBar->setVisible(true);
}